

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

Token * __thiscall Tokenizer::parseName(Token *__return_storage_ptr__,Tokenizer *this,char c)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  long lVar2;
  TokenizerException *this_01;
  char *pcVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4d0;
  tokenValue local_3d8;
  tokenValue local_3b0;
  tokenValue local_388;
  _Optional_payload_base<char> local_35a;
  undefined1 local_358 [6];
  optional<char> _1;
  tokenValue local_328;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_300;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2f8;
  const_iterator it;
  allocator<char> local_2e8;
  allocator<char> local_2e7;
  allocator<char> local_2e6;
  allocator<char> local_2e5;
  allocator<char> local_2e4;
  allocator<char> local_2e3;
  allocator<char> local_2e2;
  allocator<char> local_2e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  iterator local_1d8;
  size_type local_1d0;
  undefined1 local_1c8 [8];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defaultMethods;
  variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_170;
  bool local_141;
  variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_140;
  bool local_111;
  variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_110;
  undefined1 local_e2;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  uint local_7c;
  tokenValue local_78;
  _Optional_payload_base<char> local_4e;
  undefined1 local_40 [8];
  string res;
  optional<char> _;
  char c_local;
  Tokenizer *this_local;
  
  res.field_2._M_local_buf[0xf] = c;
  std::optional<char>::optional((optional<char> *)((long)&res.field_2 + 0xd));
  std::__cxx11::string::string((string *)local_40);
  while( true ) {
    if (((res.field_2._M_local_buf[0xf] < 'a') ||
        (bVar4 = true, 'z' < res.field_2._M_local_buf[0xf])) &&
       ((res.field_2._M_local_buf[0xf] < 'A' || (bVar4 = true, 'Z' < res.field_2._M_local_buf[0xf]))
       )) {
      bVar4 = res.field_2._M_local_buf[0xf] == '_';
    }
    if (!bVar4) break;
    std::__cxx11::string::operator+=((string *)local_40,res.field_2._M_local_buf[0xf]);
    local_4e = (_Optional_payload_base<char>)next(this);
    res.field_2._13_2_ = local_4e;
    bVar4 = std::optional<char>::has_value((optional<char> *)((long)&res.field_2 + 0xd));
    if (!bVar4) {
      std::variant<int,double,std::__cxx11::string,bool,char>::
      variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                ((variant<int,double,std::__cxx11::string,bool,char> *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      Token::Token(__return_storage_ptr__,Name,&local_78);
      std::
      variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      ::~variant(&local_78);
      local_7c = 1;
LAB_0010cf89:
      std::__cxx11::string::~string((string *)local_40);
      return __return_storage_ptr__;
    }
    pcVar3 = std::optional<char>::value((optional<char> *)((long)&res.field_2 + 0xd));
    res.field_2._M_local_buf[0xf] = *pcVar3;
  }
  unnext(this);
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0) {
    local_e2 = 1;
    this_01 = (TokenizerException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Unexpected character \'",&local_e1);
    std::operator+(&local_c0,&local_e0,res.field_2._M_local_buf[0xf]);
    std::operator+(&local_a0,&local_c0,"\'");
    TokenizerException::TokenizerException
              (this_01,&local_a0,this->line_number,this->col_number,&this->current_line);
    local_e2 = 0;
    __cxa_throw(this_01,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
  }
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"true");
  if (bVar4) {
    local_111 = true;
    std::variant<int,double,std::__cxx11::string,bool,char>::variant<bool,void,void,bool,void>
              ((variant<int,double,std::__cxx11::string,bool,char> *)&local_110,&local_111);
    Token::Token(__return_storage_ptr__,Boolean,(tokenValue *)&local_110);
    std::
    variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
    ::~variant(&local_110);
    local_7c = 1;
  }
  else {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"false");
    if (bVar4) {
      local_141 = false;
      std::variant<int,double,std::__cxx11::string,bool,char>::variant<bool,void,void,bool,void>
                ((variant<int,double,std::__cxx11::string,bool,char> *)&local_140,&local_141);
      Token::Token(__return_storage_ptr__,Boolean,(tokenValue *)&local_140);
      std::
      variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      ::~variant(&local_140);
      local_7c = 1;
    }
    else {
      iVar1 = std::__cxx11::string::compare((ulong)local_40,0,(char *)0x2);
      if (iVar1 == 0) {
        std::__cxx11::string::substr((ulong)&defaultMethods._M_h._M_single_bucket,(ulong)local_40);
        std::variant<int,double,std::__cxx11::string,bool,char>::
        variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
                  ((variant<int,double,std::__cxx11::string,bool,char> *)&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &defaultMethods._M_h._M_single_bucket);
        Token::Token(__return_storage_ptr__,Method,(tokenValue *)&local_170);
        std::
        variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
        ::~variant(&local_170);
        std::__cxx11::string::~string((string *)&defaultMethods._M_h._M_single_bucket);
        local_7c = 1;
      }
      else {
        it.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur._7_1_ = 1;
        local_2e0 = &local_2d8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"GET",&local_2e1);
        local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_2b8,"POST",&local_2e2);
        local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_298,"PUT",&local_2e3);
        local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_278,"HEAD",&local_2e4);
        local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_258,"OPTIONS",&local_2e5);
        local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_238,"DELETE",&local_2e6);
        local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_218,"TRACE",&local_2e7);
        local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_1f8,"CONNECT",&local_2e8);
        it.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur._7_1_ = 0;
        local_1d8 = &local_2d8;
        local_1d0 = 8;
        this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&it.
                             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             ._M_cur + 4);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(this_00);
        __l._M_len = local_1d0;
        __l._M_array = local_1d8;
        std::
        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1c8,__l,0,
                        (hasher *)
                        ((long)&it.
                                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                ._M_cur + 6),
                        (key_equal *)
                        ((long)&it.
                                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                ._M_cur + 5),this_00);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&it.
                                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                ._M_cur + 4));
        local_4d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8;
        do {
          local_4d0 = local_4d0 + -1;
          std::__cxx11::string::~string((string *)local_4d0);
        } while (local_4d0 != &local_2d8);
        std::allocator<char>::~allocator(&local_2e8);
        std::allocator<char>::~allocator(&local_2e7);
        std::allocator<char>::~allocator(&local_2e6);
        std::allocator<char>::~allocator(&local_2e5);
        std::allocator<char>::~allocator(&local_2e4);
        std::allocator<char>::~allocator(&local_2e3);
        std::allocator<char>::~allocator(&local_2e2);
        std::allocator<char>::~allocator(&local_2e1);
        local_2f8._M_cur =
             (__node_type *)
             std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1c8,(key_type *)local_40);
        local_300._M_cur =
             (__node_type *)
             std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1c8);
        bVar4 = std::__detail::operator!=(&local_2f8,&local_300);
        if (bVar4) {
          std::variant<int,double,std::__cxx11::string,bool,char>::
          variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                    ((variant<int,double,std::__cxx11::string,bool,char> *)&local_328,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
          Token::Token(__return_storage_ptr__,Method,&local_328);
          std::
          variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
          ::~variant(&local_328);
        }
        local_7c = (uint)bVar4;
        std::
        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1c8);
        if (local_7c == 0) {
          res.field_2._13_2_ = peek(this);
          bVar4 = std::optional<char>::has_value((optional<char> *)((long)&res.field_2 + 0xd));
          if (bVar4) {
            local_35a = (_Optional_payload_base<char>)peek(this,1);
            bVar4 = std::optional<char>::has_value((optional<char> *)&local_35a);
            if (bVar4) {
              pcVar3 = std::optional<char>::value((optional<char> *)((long)&res.field_2 + 0xd));
              if ((*pcVar3 == '[') &&
                 (pcVar3 = std::optional<char>::value((optional<char> *)&local_35a), *pcVar3 == '[')
                 ) {
                next(this,2);
                this->parsingHeaderBlock = true;
                std::__cxx11::string::operator=
                          ((string *)&this->header_block_name,(string *)local_40);
                std::variant<int,double,std::__cxx11::string,bool,char>::
                variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                          ((variant<int,double,std::__cxx11::string,bool,char> *)&local_3b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_40);
                Token::Token(__return_storage_ptr__,HeaderOpener,&local_3b0);
                std::
                variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                ::~variant(&local_3b0);
                local_7c = 1;
              }
              else {
                std::variant<int,double,std::__cxx11::string,bool,char>::
                variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                          ((variant<int,double,std::__cxx11::string,bool,char> *)&local_3d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_40);
                Token::Token(__return_storage_ptr__,Name,&local_3d8);
                std::
                variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                ::~variant(&local_3d8);
                local_7c = 1;
              }
            }
            else {
              std::variant<int,double,std::__cxx11::string,bool,char>::
              variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                        ((variant<int,double,std::__cxx11::string,bool,char> *)&local_388,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
              Token::Token(__return_storage_ptr__,Name,&local_388);
              std::
              variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
              ::~variant(&local_388);
              local_7c = 1;
            }
          }
          else {
            std::variant<int,double,std::__cxx11::string,bool,char>::
            variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                      ((variant<int,double,std::__cxx11::string,bool,char> *)local_358,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
            Token::Token(__return_storage_ptr__,Name,(tokenValue *)local_358);
            std::
            variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
            ::~variant((variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                        *)local_358);
            local_7c = 1;
          }
        }
      }
    }
  }
  goto LAB_0010cf89;
}

Assistant:

Token Tokenizer::parseName(char c) {
    optional<char> _;
    string res;
    // while it's a valid name char
    while ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z') || c == '_') {
        res += c;
        _ = next();
        if (!_.has_value()) {
            return Token(Name, res);
        }
        c = _.value();
    }
    unnext();

    if (res.length() == 0) {
        throw TokenizerException(string("Unexpected character '") + c + "'", line_number, col_number, current_line);
    }

    if (res == "true")
        return Token(Boolean, true);
    else if (res == "false")
        return Token(Boolean, false);
    else {
        // Http Method parsing
        if (res.compare(0, 2, "M_") == 0) {
            return Token(Method, res.substr(2));
        }
        const unordered_set<string> defaultMethods =
                {"GET", "POST", "PUT", "HEAD", "OPTIONS", "DELETE", "TRACE", "CONNECT"};
        auto it = defaultMethods.find(res);
        if (it != defaultMethods.end()) {
            return Token(Method, res);
        }
    }

    _ = peek();
    if (!_.has_value()) {
        return Token(Name, res);
    }
    optional<char> _1 = peek(1);
    if (!_1.has_value()) {
        return Token(Name, res);
    }

    if (_.value() == '[' && _1.value() == '[') {
        next(2);
        parsingHeaderBlock = true;
        header_block_name = res;
        return Token(HeaderOpener, res);
    }
    return Token(Name, res);
}